

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,Reader proto,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *clientBrand)

{
  SegmentReader **ppSVar1;
  undefined8 *puVar2;
  size_t sVar3;
  Scope *pSVar4;
  SegmentReader *pSVar5;
  CapTableReader *pCVar6;
  Reader type;
  StructReader *pSVar7;
  ListElementCount LVar8;
  StructReader *this_00;
  PointerReader *__s;
  SegmentReader *pSVar9;
  RawBrandedSchema *pRVar10;
  ulong uVar11;
  ulong uVar12;
  PointerReader *result;
  long lVar13;
  ElementCount index;
  unsigned_long j;
  ulong uVar14;
  StructReader *pSVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  StringPtr scopeName;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> AVar20;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> AVar21;
  Array<capnp::_::RawBrandedSchema::Binding> dstBindings_heap;
  Array<capnp::_::RawBrandedSchema::Scope> dstScopes_heap;
  Reader srcScope;
  Reader srcBinding;
  Reader srcBindings;
  Reader srcScopes;
  Binding dstBindings_stack [16];
  Scope dstScopes_stack [16];
  ulong local_460;
  PointerReader *local_448;
  ulong uStack_440;
  undefined8 *local_438;
  StructReader *local_428;
  ulong uStack_420;
  undefined8 *local_418;
  StructReader local_3e8;
  StructReader local_3b8;
  PointerReader local_388;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_360;
  StructReader local_348;
  ListReader local_318;
  ListReader local_2e8;
  PointerReader local_2b8 [8];
  StructReader local_1b8 [8];
  
  local_2b8[0].pointer = (WirePointer *)schema->encodedNode;
  local_2b8[0].segment = (SegmentReader *)0x0;
  local_2b8[0].capTable = (CapTableReader *)0x0;
  local_2b8[0].nestingLimit = 0x7fffffff;
  _::PointerReader::getStruct(local_1b8,local_2b8,(word *)0x0);
  local_2b8[0].pointer = (WirePointer *)0x0;
  local_2b8[0].nestingLimit = 0x7fffffff;
  if (local_1b8[0].pointerCount != 0) {
    local_2b8[0].pointer =
         (WirePointer *)CONCAT44(local_1b8[0].pointers._4_4_,(int)local_1b8[0].pointers);
    local_2b8[0].nestingLimit = local_1b8[0].nestingLimit;
  }
  uVar16 = 0;
  uVar17 = 0;
  uVar18 = 0;
  uVar19 = 0;
  if (local_1b8[0].pointerCount != 0) {
    uVar16 = local_1b8[0].segment._0_4_;
    uVar17 = local_1b8[0].segment._4_4_;
    uVar18 = local_1b8[0].capTable._0_4_;
    uVar19 = local_1b8[0].capTable._4_4_;
  }
  local_2b8[0].segment = (SegmentReader *)CONCAT44(uVar17,uVar16);
  local_2b8[0].capTable = (CapTableReader *)CONCAT44(uVar19,uVar18);
  scopeName.content =
       (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(local_2b8,(void *)0x0,0);
  local_1b8[0].data = (WirePointer *)0x0;
  local_1b8[0].pointers._0_4_ = 0x7fffffff;
  if (proto._reader.pointerCount != 0) {
    local_1b8[0].data = proto._reader.pointers;
    local_1b8[0].pointers._0_4_ = proto._reader.nestingLimit;
  }
  local_1b8[0].segment._0_4_ = 0;
  local_1b8[0].segment._4_4_ = 0;
  local_1b8[0].capTable._0_4_ = 0;
  local_1b8[0].capTable._4_4_ = 0;
  if (proto._reader.pointerCount != 0) {
    local_1b8[0].segment._0_4_ = proto._reader.segment._0_4_;
    local_1b8[0].segment._4_4_ = proto._reader.segment._4_4_;
    local_1b8[0].capTable._0_4_ = proto._reader.capTable._0_4_;
    local_1b8[0].capTable._4_4_ = proto._reader.capTable._4_4_;
  }
  this_00 = local_1b8;
  _::PointerReader::getList(&local_2e8,(PointerReader *)this_00,INLINE_COMPOSITE,(word *)0x0);
  uVar11 = (ulong)local_2e8.elementCount;
  if (uVar11 < 0x11) {
    local_428 = (StructReader *)0x0;
    uStack_420 = 0;
    local_418 = (undefined8 *)0x0;
  }
  else {
    this_00 = (StructReader *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x18,uVar11,uVar11,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_418 = &kj::_::HeapArrayDisposer::instance;
    local_428 = this_00;
    uStack_420 = uVar11;
  }
  local_460 = 0;
  memset(this_00,0,uVar11 * 0x18);
  if (local_2e8.elementCount != 0) {
    index = 0;
    uVar11 = 0;
    do {
      _::ListReader::getStructElement(&local_3e8,&local_2e8,index);
      if ((local_3e8.dataSize < 0x50) || (*(short *)((long)local_3e8.data + 8) == 0)) {
        local_2b8[0].nestingLimit = local_3e8.nestingLimit;
        local_2b8[0].pointer = local_3e8.pointers;
        if (local_3e8.pointerCount == 0) {
          local_2b8[0].pointer = (WirePointer *)0x0;
          local_2b8[0].nestingLimit = 0x7fffffff;
        }
        uVar16 = 0;
        uVar17 = 0;
        uVar18 = 0;
        uVar19 = 0;
        if (local_3e8.pointerCount != 0) {
          uVar16 = local_3e8.segment._0_4_;
          uVar17 = local_3e8.segment._4_4_;
          uVar18 = local_3e8.capTable._0_4_;
          uVar19 = local_3e8.capTable._4_4_;
        }
        local_2b8[0].segment = (SegmentReader *)CONCAT44(uVar17,uVar16);
        local_2b8[0].capTable = (CapTableReader *)CONCAT44(uVar19,uVar18);
        _::PointerReader::getList(&local_318,local_2b8,INLINE_COMPOSITE,(word *)0x0);
        LVar8 = local_318.elementCount;
        uVar12 = (ulong)local_318.elementCount;
        if (uVar12 < 0x11) {
          local_448 = (PointerReader *)0x0;
          uStack_440 = 0;
          local_438 = (undefined8 *)0x0;
          __s = local_2b8;
        }
        else {
          __s = (PointerReader *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (0x10,uVar12,uVar12,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
          ;
          local_438 = &kj::_::HeapArrayDisposer::instance;
          local_448 = __s;
          uStack_440 = uVar12;
        }
        memset(__s,0,uVar12 << 4);
        uVar12 = (ulong)local_318.elementCount;
        if (uVar12 != 0) {
          uVar14 = 0;
          result = __s;
          do {
            _::ListReader::getStructElement(&local_3b8,&local_318,(ElementCount)uVar14);
            result->segment = (SegmentReader *)0x0;
            result->capTable = (CapTableReader *)0x0;
            *(undefined1 *)&result->segment = 0x12;
            if ((0xf < local_3b8.dataSize) && (*local_3b8.data == 1)) {
              local_388.segment._0_4_ = local_3b8.segment._0_4_;
              local_388.segment._4_4_ = local_3b8.segment._4_4_;
              local_388.capTable._0_4_ = local_3b8.capTable._0_4_;
              local_388.capTable._4_4_ = local_3b8.capTable._4_4_;
              local_388.nestingLimit = local_3b8.nestingLimit;
              local_388.pointer = local_3b8.pointers;
              if (local_3b8.pointerCount == 0) {
                local_388.pointer = (WirePointer *)0x0;
                local_388.segment._0_4_ = 0;
                local_388.segment._4_4_ = 0;
                local_388.capTable._0_4_ = 0;
                local_388.capTable._4_4_ = 0;
                local_388.nestingLimit = 0x7fffffff;
              }
              _::PointerReader::getStruct(&local_348,&local_388,(word *)0x0);
              local_360.ptr.isSet = (clientBrand->ptr).isSet;
              if (local_360.ptr.isSet == true) {
                local_360.ptr.field_1.value.ptr = (clientBrand->ptr).field_1.value.ptr;
                local_360.ptr.field_1.value.size_ = (clientBrand->ptr).field_1.value.size_;
              }
              type._reader.capTable = local_348.capTable;
              type._reader.segment = local_348.segment;
              type._reader.data = local_348.data;
              type._reader.pointers = local_348.pointers;
              type._reader.dataSize = local_348.dataSize;
              type._reader.pointerCount = local_348.pointerCount;
              type._reader._38_2_ = local_348._38_2_;
              type._reader.nestingLimit = local_348.nestingLimit;
              type._reader._44_4_ = local_348._44_4_;
              makeDep(this,(Binding *)result,type,scopeName,&local_360);
            }
            uVar14 = uVar14 + 1;
            result = (PointerReader *)&result->pointer;
          } while (uVar12 != uVar14);
        }
        if (local_3e8.dataSize < 0x40) {
          pSVar9 = (SegmentReader *)0x0;
        }
        else {
          pSVar9 = *local_3e8.data;
        }
        ppSVar1 = &this_00->segment + uVar11 * 3;
        *ppSVar1 = pSVar9;
        *(ListElementCount *)(ppSVar1 + 2) = LVar8;
        AVar20.size_._0_4_ = LVar8;
        AVar20.ptr = (Binding *)__s;
        AVar20.size_._4_4_ = 0;
        AVar20 = copyDeduped<capnp::_::RawBrandedSchema::Binding>(this,AVar20);
        ppSVar1[1] = (SegmentReader *)AVar20.ptr;
        if (local_448 != (PointerReader *)0x0) {
          (**(code **)*local_438)(local_438,local_448,0x10,uStack_440,uStack_440,0);
        }
        local_460 = (ulong)((int)uVar11 + 1);
      }
      else {
        local_460 = uVar11;
        if (*(short *)((long)local_3e8.data + 8) == 1) {
          local_460 = (ulong)((int)uVar11 + 1);
          ppSVar1 = &this_00->segment + uVar11 * 3;
          pSVar9 = *local_3e8.data;
          *ppSVar1 = pSVar9;
          if ((clientBrand->ptr).isSet == true) {
            sVar3 = (clientBrand->ptr).field_1.value.size_;
            if (sVar3 != 0) {
              pSVar4 = (clientBrand->ptr).field_1.value.ptr;
              lVar13 = 0;
              do {
                if (*(SegmentReader **)((long)&pSVar4->typeId + lVar13) == pSVar9) {
                  ppSVar1[2] = (SegmentReader *)
                               *(WirePointer **)((long)&pSVar4->bindingCount + lVar13);
                  puVar2 = (undefined8 *)((long)&pSVar4->typeId + lVar13);
                  pCVar6 = (CapTableReader *)puVar2[1];
                  *ppSVar1 = (SegmentReader *)*puVar2;
                  ppSVar1[1] = (SegmentReader *)pCVar6;
                  break;
                }
                lVar13 = lVar13 + 0x18;
              } while (sVar3 * 0x18 != lVar13);
            }
          }
          else {
            *(undefined1 *)((long)ppSVar1 + 0x14) = 1;
          }
        }
      }
      index = index + 1;
      uVar11 = local_460;
    } while (index != local_2e8.elementCount);
    if ((uint)local_460 == 0) {
      local_460 = 0;
    }
    else {
      ppSVar1 = &this_00->segment + local_460 * 3;
      lVar13 = 0x3f;
      if (local_460 != 0) {
        for (; local_460 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<capnp::_::RawBrandedSchema::Scope*,long,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBranded(capnp::_::RawSchema_const*,capnp::schema::Brand::Reader,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                (this_00,ppSVar1,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      if ((uint)local_460 < 0x11) {
        std::
        __insertion_sort<capnp::_::RawBrandedSchema::Scope*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBranded(capnp::_::RawSchema_const*,capnp::schema::Brand::Reader,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                  (this_00,ppSVar1);
      }
      else {
        pSVar15 = this_00 + 8;
        std::
        __insertion_sort<capnp::_::RawBrandedSchema::Scope*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBranded(capnp::_::RawSchema_const*,capnp::schema::Brand::Reader,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                  (this_00,pSVar15);
        do {
          pSVar9 = pSVar15->segment;
          local_2b8[0].segment = (SegmentReader *)pSVar15->capTable;
          local_2b8[0].capTable = (CapTableReader *)pSVar15->data;
          pSVar5 = (SegmentReader *)pSVar15[-1].pointers;
          pSVar7 = pSVar15;
          while (pSVar9 < pSVar5) {
            pSVar7->data = *(WirePointer **)&pSVar7[-1].nestingLimit;
            pCVar6 = *(CapTableReader **)&pSVar7[-1].dataSize;
            pSVar7->segment = (SegmentReader *)pSVar7[-1].pointers;
            pSVar7->capTable = pCVar6;
            pSVar5 = (pSVar7 + -2)[1].segment;
            pSVar7 = (StructReader *)&pSVar7[-1].pointers;
          }
          pSVar7->segment = pSVar9;
          pSVar7->capTable = (CapTableReader *)local_2b8[0].segment;
          pSVar7->data = local_2b8[0].capTable;
          pSVar15 = (StructReader *)&pSVar15->pointers;
        } while (pSVar15 != (StructReader *)ppSVar1);
      }
    }
  }
  AVar21.size_ = local_460;
  AVar21.ptr = (Scope *)this_00;
  AVar21 = copyDeduped<capnp::_::RawBrandedSchema::Scope>(this,AVar21);
  pRVar10 = makeBranded(this,schema,AVar21);
  if (local_428 != (StructReader *)0x0) {
    (**(code **)*local_418)(local_418,local_428,0x18,uStack_420,uStack_420,0);
  }
  return pRVar10;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, schema::Brand::Reader proto,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> clientBrand) {
  kj::StringPtr scopeName =
      readMessageUnchecked<schema::Node>(schema->encodedNode).getDisplayName();

  auto srcScopes = proto.getScopes();

  KJ_STACK_ARRAY(_::RawBrandedSchema::Scope, dstScopes, srcScopes.size(), 16, 32);
  memset(dstScopes.begin(), 0, dstScopes.size() * sizeof(dstScopes[0]));

  uint dstScopeCount = 0;
  for (auto srcScope: srcScopes) {
    switch (srcScope.which()) {
      case schema::Brand::Scope::BIND: {
        auto srcBindings = srcScope.getBind();
        KJ_STACK_ARRAY(_::RawBrandedSchema::Binding, dstBindings, srcBindings.size(), 16, 32);
        memset(dstBindings.begin(), 0, dstBindings.size() * sizeof(dstBindings[0]));

        for (auto j: kj::indices(srcBindings)) {
          auto srcBinding = srcBindings[j];
          auto& dstBinding = dstBindings[j];

          memset(&dstBinding, 0, sizeof(dstBinding));
          dstBinding.which = schema::Type::ANY_POINTER;

          switch (srcBinding.which()) {
            case schema::Brand::Binding::UNBOUND:
              break;
            case schema::Brand::Binding::TYPE: {
              makeDep(dstBinding, srcBinding.getType(), scopeName, clientBrand);
              break;
            }
          }
        }

        auto& dstScope = dstScopes[dstScopeCount++];
        dstScope.typeId = srcScope.getScopeId();
        dstScope.bindingCount = dstBindings.size();
        dstScope.bindings = copyDeduped(dstBindings).begin();
        break;
      }
      case schema::Brand::Scope::INHERIT: {
        // Inherit the whole scope from the client -- or if the client doesn't have it, at least
        // include an empty dstScope in the list just to show that this scope was specified as
        // inherited, as opposed to being unspecified (which would be treated as all AnyPointer).
        auto& dstScope = dstScopes[dstScopeCount++];
        dstScope.typeId = srcScope.getScopeId();

        KJ_IF_SOME(b, clientBrand) {
          for (auto& clientScope: b) {
            if (clientScope.typeId == dstScope.typeId) {
              // Overwrite the whole thing.
              dstScope = clientScope;
              break;
            }
          }
        } else {
          dstScope.isUnbound = true;
        }
        break;
      }
    }
  }